

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HomeChecker.cpp
# Opt level: O3

bool __thiscall
tiger::trains::ai::HomeChecker::needHome
          (HomeChecker *this,Train *train,int len,int homeLen,GoodType type)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  _Base_ptr p_Var6;
  Player *this_00;
  Town *this_01;
  _Base_ptr p_Var7;
  double dVar8;
  Train *local_38;
  
  local_38 = train;
  iVar3 = world::Train::getGoods(train);
  if (iVar3 == 0) {
LAB_0014f833:
    bVar2 = false;
  }
  else {
    p_Var6 = (this->goingHomeTrain)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var6 != (_Base_ptr)0x0) {
      p_Var1 = &(this->goingHomeTrain)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = &p_Var1->_M_header;
      do {
        if (*(Train **)(p_Var6 + 1) >= train) {
          p_Var7 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[*(Train **)(p_Var6 + 1) < train];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(Train **)(p_Var7 + 1) <= train)) {
        return true;
      }
    }
    this_00 = world::Train::getPlayer(train);
    this_01 = (Town *)world::Player::getHome(this_00);
    if (type == PRODUCT) {
      iVar3 = world::Town::getProduct(this_01);
      dVar8 = ceil(this->dec_product * (double)len);
      iVar4 = world::Town::getPopulation(this_01);
      iVar5 = world::Train::getGoods(train);
      if (len <= (iVar3 - (int)dVar8) / iVar4) {
        iVar3 = world::Town::predictProduct(this_01,homeLen);
        dVar8 = ceil((double)len * this->dec_product);
        iVar4 = world::Town::getProductCapacity(this_01);
        if ((iVar3 + iVar5) - (int)dVar8 <= iVar4) goto LAB_0014f833;
      }
    }
    else {
      iVar3 = world::Town::getArrmor(this_01);
      dVar8 = this->dec_armor;
      iVar4 = world::Train::getGoods(train);
      if (len < 0x97) {
        dVar8 = ceil(dVar8 * (double)len);
        iVar5 = world::Town::getArrmorCapacity(this_01);
        if ((iVar4 + iVar3) - (int)dVar8 <= iVar5) goto LAB_0014f833;
      }
    }
    std::
    _Rb_tree<tiger::trains::world::Train_const*,tiger::trains::world::Train_const*,std::_Identity<tiger::trains::world::Train_const*>,std::less<tiger::trains::world::Train_const*>,std::allocator<tiger::trains::world::Train_const*>>
    ::_M_insert_unique<tiger::trains::world::Train_const*const&>
              ((_Rb_tree<tiger::trains::world::Train_const*,tiger::trains::world::Train_const*,std::_Identity<tiger::trains::world::Train_const*>,std::less<tiger::trains::world::Train_const*>,std::allocator<tiger::trains::world::Train_const*>>
                *)&this->goingHomeTrain,&local_38);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool HomeChecker::needHome(world::Train *train, int len, int homeLen, models::GoodType type)
{
    if (train->getGoods() == 0)
        return false;

    if (goingHomeTrain.count(train) != 0)
        return true;

    const world::Town *homeTown = (world::Town *)train->getPlayer()->getHome();

    if (type == models::GoodType::PRODUCT)
    {
        int predict = homeTown->getProduct() - (int)std::ceil(dec_product*len);
        int maxLen = predict / homeTown->getPopulation();
        int curProduct = train->getGoods();


        if (maxLen < len)
        {
            goingHomeTrain.insert(train);
            return true;
        }


        predict = homeTown->predictProduct(homeLen) -
                  (int)std::ceil(dec_product*len);

        if (curProduct + predict > homeTown->getProductCapacity())
        {
            goingHomeTrain.insert(train);
            return true;
        }

        return false;
    }
    else
    {
        int predict = homeTown->getArrmor() - (int)std::ceil(dec_armor*len);
        int maxLen = 150;
        int curProduct = train->getGoods();

        if (maxLen < len)
        {
            goingHomeTrain.insert(train);
            return true;
        }

        if (curProduct + predict > homeTown->getArrmorCapacity())
        {
            goingHomeTrain.insert(train);
            return true;
        }

        return false;
    }
}